

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomBuilderCmd.cpp
# Opt level: O3

int cmdline_parser_internal
              (int argc,char **argv,gengetopt_args_info *args_info,cmdline_parser_params *params,
              char *additional_error)

{
  int iVar1;
  cmdline_parser_arg_type arg_type;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  void *pvVar9;
  size_t sVar10;
  char *pcVar11;
  int *piVar12;
  char **ppcVar13;
  double *pdVar14;
  int iVar15;
  uint uVar16;
  option *poVar17;
  uint *puVar18;
  gengetopt_args_info *extraout_RDX;
  gengetopt_args_info *additional_error_00;
  gengetopt_args_info *extraout_RDX_00;
  gengetopt_args_info *extraout_RDX_01;
  gengetopt_args_info *extraout_RDX_02;
  gengetopt_args_info *extraout_RDX_03;
  uint *extraout_RDX_04;
  uint *extraout_RDX_05;
  uint *field_given;
  uint *extraout_RDX_06;
  gengetopt_args_info *extraout_RDX_07;
  gengetopt_args_info *extraout_RDX_08;
  gengetopt_args_info *extraout_RDX_09;
  size_t sVar19;
  ulong uVar20;
  char *pcVar21;
  char cVar22;
  char *pcVar23;
  char **possible_values;
  int iVar24;
  double *__ptr;
  char *pcVar25;
  int iVar26;
  option *poVar27;
  option *poVar28;
  option *poVar29;
  bool bVar30;
  char cVar31;
  undefined4 in_stack_fffffffffffffda8;
  int iVar32;
  double *local_248;
  int local_22c;
  option *local_220;
  gengetopt_args_info local_128;
  
  package_name = *argv;
  iVar7 = params->override;
  iVar1 = params->check_required;
  arg_type = params->check_ambiguity;
  additional_error_00 = args_info;
  if (params->initialize != 0) {
    cmdline_parser_init(args_info);
    additional_error_00 = extraout_RDX;
  }
  local_128.lattice_given = 0;
  local_128.nx_given = 0;
  local_128.ny_given = 0;
  local_128.nz_given = 0;
  local_128.molFraction_given = 0;
  local_128.help_given = 0;
  local_128.version_given = 0;
  local_128.output_given = 0;
  local_128.density_given = 0;
  local_128.density_orig = (char *)0x0;
  local_128.nx_orig = (char *)0x0;
  local_128.ny_orig = (char *)0x0;
  local_128.nz_orig = (char *)0x0;
  local_128.output_arg = (char *)0x0;
  local_128.output_orig = (char *)0x0;
  local_128.molFraction_arg = (double *)0x0;
  local_128.molFraction_orig = (char **)0x0;
  local_128.lattice_arg = (char *)0x0;
  local_128.lattice_orig = (char *)0x0;
  local_128.help_help = gengetopt_args_info_help[0];
  local_128.version_help = gengetopt_args_info_help[1];
  local_128.output_help = gengetopt_args_info_help[2];
  local_128.density_help = gengetopt_args_info_help[3];
  local_128.nx_help = gengetopt_args_info_help[4];
  local_128.ny_help = gengetopt_args_info_help[5];
  local_128.nz_help = gengetopt_args_info_help[6];
  local_128.molFraction_help = gengetopt_args_info_help[7];
  local_128.molFraction_min = 0;
  local_128.molFraction_max = 0;
  local_128.lattice_help = gengetopt_args_info_help[8];
  local_128.inputs = (char **)0x0;
  local_128.inputs_num = 0;
  custom_opterr = params->print_errors;
  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = 0;
  __ptr = (double *)0x0;
  iVar24 = 0;
  if (argc < 1) {
LAB_0012c138:
    uVar16 = local_128.molFraction_given;
    custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    if (__ptr != (double *)0x0 && local_128.molFraction_given != 0) {
      uVar2 = args_info->molFraction_given;
      sVar19 = (ulong)(local_128.molFraction_given + uVar2) << 3;
      ppcVar13 = (char **)realloc(args_info->molFraction_orig,sVar19);
      args_info->molFraction_orig = ppcVar13;
      pdVar14 = (double *)realloc(args_info->molFraction_arg,sVar19);
      args_info->molFraction_arg = pdVar14;
      additional_error_00 = extraout_RDX_07;
      if (-1 < (int)(uVar16 - 1)) {
        uVar20 = (ulong)(uVar16 - 1);
        do {
          uVar16 = uVar2 + (int)uVar20;
          args_info->molFraction_arg[uVar16] = *__ptr;
          args_info->molFraction_orig[uVar16] = (char *)__ptr[1];
          pdVar14 = (double *)__ptr[2];
          free(__ptr);
          bVar30 = uVar20 != 0;
          uVar20 = uVar20 - 1;
          additional_error_00 = extraout_RDX_08;
          __ptr = pdVar14;
        } while (bVar30);
      }
    }
    args_info->molFraction_given = args_info->molFraction_given + local_128.molFraction_given;
    local_128._216_8_ = local_128._216_8_ & 0xffffffff;
    if (iVar1 == 0) {
      cmdline_parser_release(&local_128);
    }
    else {
      iVar7 = cmdline_parser_required2(args_info,*argv,(char *)additional_error_00);
      cmdline_parser_release(&local_128);
      if (iVar7 != 0) {
        return 1;
      }
    }
    iVar7 = 0;
    uVar16 = argc - iVar24;
    if (uVar16 != 0 && iVar24 <= argc) {
      args_info->inputs_num = uVar16;
      ppcVar13 = (char **)malloc((ulong)uVar16 * 8);
      args_info->inputs = ppcVar13;
      iVar7 = 0;
      uVar20 = 0;
      do {
        pcVar23 = gengetopt_strdup(argv[(long)iVar24 + uVar20]);
        args_info->inputs[uVar20] = pcVar23;
        uVar20 = uVar20 + 1;
      } while (uVar16 != uVar20);
    }
  }
  else {
    __ptr = (double *)0x0;
    puVar18 = &local_128.output_given;
    pcVar23 = (char *)&args_info->output_given;
    iVar32 = custom_opterr;
    pcVar21 = custom_optarg;
    iVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
LAB_0012b8a6:
    do {
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar24;
      custom_optarg = pcVar21;
      custom_opterr = iVar32;
      iVar32 = custom_opterr;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = (char *)0x0;
      if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == 0) ||
         ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 & 1) == 0)) {
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == 0) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = 1;
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 = 1;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
LAB_0012b90e:
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        additional_error_00 =
             (gengetopt_args_info *)
             CONCAT71((int7)((ulong)puVar18 >> 8),
                      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
                      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 ||
                      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 ==
                      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7);
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 ||
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 ==
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
          if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 !=
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          }
        }
        else {
          exchange(argv,(custom_getopt_data *)pcVar23);
          additional_error_00 = extraout_RDX_00;
        }
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 < argc) {
          ppcVar13 = argv + _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          while ((**ppcVar13 != '-' || ((*ppcVar13)[1] == '\0'))) {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
            ppcVar13 = ppcVar13 + 1;
            if (argc == _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
              piVar12 = &_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7;
              goto LAB_0012c089;
            }
          }
        }
        iVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == argc) {
LAB_0012c08f:
          if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 != argc) {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
            iVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
          }
          goto LAB_0012c138;
        }
        lVar8 = (long)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        pcVar21 = argv[lVar8];
        if (*pcVar21 != '-') {
LAB_0012c459:
          uVar20 = 1;
          custom_optarg = pcVar21;
          iVar32 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar21;
          goto LAB_0012c476;
        }
        cVar31 = pcVar21[1];
        additional_error_00 =
             (gengetopt_args_info *)CONCAT71((int7)((ulong)additional_error_00 >> 8),cVar31);
        if (cVar31 == '-') {
          if (pcVar21[2] == '\0') {
            iVar7 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
            iVar24 = iVar7;
            if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 !=
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar7;
              exchange(argv,(custom_getopt_data *)pcVar23);
              additional_error_00 = extraout_RDX_09;
              iVar7 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
              iVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
            }
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 = iVar24;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar7;
            piVar12 = &_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = argc;
LAB_0012c089:
            *piVar12 = argc;
            iVar24 = argc;
            goto LAB_0012c08f;
          }
        }
        else if (cVar31 == '\0') goto LAB_0012c459;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar21 + (ulong)(cVar31 == '-') + 1;
      }
      else {
        if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 == (char *)0x0) ||
           (*_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 == '\0')) goto LAB_0012b90e;
        lVar8 = (long)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      pcVar21 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
      iVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      pcVar23 = argv[lVar8];
      if (pcVar23[1] == '-') {
        for (sVar19 = 0;
            (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5[sVar19] != '\0' &&
            (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5[sVar19] != '='));
            sVar19 = sVar19 + 1) {
        }
        local_22c = -1;
        iVar26 = 0;
        pcVar25 = "help";
        bVar30 = false;
        local_220 = (option *)0x0;
        poVar27 = cmdline_parser_internal::long_options;
        poVar28 = poVar27;
        bVar3 = bVar30;
        iVar15 = iVar26;
        do {
          while (iVar5 = strncmp(pcVar25,pcVar21,sVar19), poVar17 = local_220, iVar6 = local_22c,
                iVar5 == 0) {
            poVar29 = poVar27 + 1;
            bVar4 = bVar30;
            do {
              iVar5 = iVar26;
              sVar10 = strlen(pcVar25);
              if ((int)sVar10 == (int)sVar19) {
                poVar17 = poVar29 + -1;
                goto LAB_0012bbe4;
              }
              poVar17 = poVar28;
              poVar27 = poVar28;
              iVar26 = iVar15;
              iVar6 = iVar15;
              bVar30 = bVar3;
              if (local_220 == (option *)0x0) goto LAB_0012bb9f;
              if (((local_220->has_arg == poVar29[-1].has_arg) &&
                  (local_220->flag == poVar29[-1].flag)) && (local_220->val == poVar29[-1].val)) {
                poVar17 = local_220;
                poVar27 = poVar29 + -1;
                iVar26 = iVar5;
                iVar6 = local_22c;
                bVar30 = bVar4;
                goto LAB_0012bb9f;
              }
              pcVar25 = poVar29->name;
              if (pcVar25 == (char *)0x0) goto LAB_0012c0a6;
              iVar6 = strncmp(pcVar25,pcVar21,sVar19);
              poVar29 = poVar29 + 1;
              bVar30 = true;
              iVar26 = iVar5 + 1;
              bVar4 = bVar30;
            } while (iVar6 == 0);
            iVar26 = iVar5 + 2;
            pcVar25 = poVar29->name;
            poVar27 = poVar29;
            if (pcVar25 == (char *)0x0) goto LAB_0012c0a6;
          }
LAB_0012bb9f:
          local_22c = iVar6;
          iVar26 = iVar26 + 1;
          pcVar25 = poVar27[1].name;
          poVar27 = poVar27 + 1;
          local_220 = poVar17;
          poVar28 = poVar27;
          bVar3 = bVar30;
          iVar15 = iVar26;
        } while (pcVar25 != (char *)0x0);
        if (bVar30) {
LAB_0012c0a6:
          if (iVar32 != 0) {
            fprintf(_stderr,"%s: option `%s\' is ambiguous\n",*argv,pcVar23);
            pcVar21 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
            iVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          }
          sVar19 = strlen(pcVar21);
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar21 + sVar19;
        }
        else {
          iVar5 = local_22c;
          if (poVar17 != (option *)0x0) {
LAB_0012bbe4:
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar24 + 1;
            if (pcVar21[sVar19] == '\0') {
              if (poVar17->has_arg == 1) {
                if (argc <= _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
                  if (iVar32 != 0) {
                    fprintf(_stderr,"%s: option `%s\' requires an argument\n",*argv,pcVar23);
                    pcVar21 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
                  }
                  goto LAB_0012c39f;
                }
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                     argv[_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0];
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar24 + 2;
              }
            }
            else {
              if (poVar17->has_arg == 0) {
                pcVar21 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
                if (iVar32 != 0) {
                  if (pcVar23[1] == '-') {
                    fprintf(_stderr,"%s: option `--%s\' doesn\'t allow an argument\n",*argv,
                            poVar17->name);
                    pcVar21 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
                  }
                  else {
                    fprintf(_stderr,"%s: option `%c%s\' doesn\'t allow an argument\n",*argv,
                            (ulong)(uint)(int)*pcVar23,poVar17->name);
                    pcVar21 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
                  }
                }
LAB_0012c39f:
                sVar19 = strlen(pcVar21);
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar21 + sVar19;
                pcVar25 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
                break;
              }
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar21 + sVar19 + 1;
            }
            iVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
            cVar31 = '}';
            sVar19 = strlen(pcVar21);
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar21 + sVar19;
            uVar20 = (ulong)(uint)poVar17->val;
            additional_error_00 = extraout_RDX_02;
            if ((uint *)poVar17->flag == (uint *)0x0) goto LAB_0012bd5f;
            *poVar17->flag = poVar17->val;
            iVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
            goto LAB_0012bdda;
          }
          if (iVar32 != 0) {
            fprintf(_stderr,"%s: unrecognized option `--%s\'\n",*argv,pcVar21);
            iVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          }
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = "";
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar24 + 1;
        pcVar25 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
        break;
      }
      pcVar23 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 + 1;
      cVar22 = *_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
      uVar16 = (uint)cVar22;
      uVar20 = (ulong)uVar16;
      cVar31 = 'N';
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar23;
      pvVar9 = memchr("hVo:l:",uVar16,7);
      if (pcVar21[1] == '\0') {
        iVar24 = iVar24 + 1;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar24;
      }
      if ((pvVar9 == (void *)0x0) || (cVar22 == ':')) {
        pcVar25 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
        if (iVar32 != 0) {
          fprintf(_stderr,"%s: invalid option -- %c\n",*argv,uVar20);
          pcVar25 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
        }
        break;
      }
      iVar5 = 0;
      additional_error_00 = extraout_RDX_01;
      if (*(char *)((long)pvVar9 + 1) == ':') {
        if (*(char *)((long)pvVar9 + 2) == ':') {
          if (*pcVar23 == '\0') {
            pcVar23 = (char *)0x0;
          }
          else {
            iVar24 = iVar24 + 1;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar24;
          }
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar23;
        }
        else {
          if (*pcVar23 == '\0') {
            if (iVar24 != argc) {
              additional_error_00 = (gengetopt_args_info *)argv;
              pcVar23 = argv[iVar24];
              goto LAB_0012bd49;
            }
            cVar22 = '?';
            if (iVar32 != 0) {
              cVar31 = '\x1f';
              fprintf(_stderr,"%s: option requires an argument -- %c\n",*argv,(ulong)uVar16);
              additional_error_00 = extraout_RDX_03;
              iVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
            }
          }
          else {
LAB_0012bd49:
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar23;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar24 + 1;
            iVar24 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          }
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
          uVar20 = (ulong)(uint)(int)cVar22;
        }
      }
LAB_0012bd5f:
      custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
      iVar26 = (int)uVar20;
      if (iVar26 < 0x68) {
        iVar32 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        if (0x3e < iVar26) {
          pcVar25 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
          if (iVar26 != 0x3f) {
            if (iVar26 != 0x56) goto LAB_0012c476;
            cmdline_parser_print_version();
            goto LAB_0012c487;
          }
          break;
        }
        if (iVar26 != 0) {
          if (iVar26 != -1) goto LAB_0012c476;
          goto LAB_0012c138;
        }
LAB_0012bdda:
        pcVar21 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
        pcVar25 = cmdline_parser_internal::long_options[iVar5].name;
        cVar31 = -9;
        custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
        iVar32 = custom_opterr;
        iVar26 = strcmp(pcVar25,"density");
        if (iVar26 == 0) {
          possible_values = (char **)0x0;
          pcVar11 = (char *)0x2d;
          iVar26 = 0x28f827;
          pcVar25 = (char *)0x3;
          puVar18 = &local_128.density_given;
          field_given = &args_info->density_given;
          pcVar23 = (char *)&args_info->density_orig;
          ppcVar13 = (char **)&args_info->density_arg;
        }
        else {
          if (*pcVar25 != 'n') {
LAB_0012be34:
            pcVar23 = "molFraction";
            iVar26 = strcmp(pcVar25,"molFraction");
            puVar18 = extraout_RDX_04;
            if (iVar26 == 0) {
              pcVar25 = get_multiple_arg_token(pcVar21);
              pcVar11 = get_multiple_arg_token_next(pcVar21);
              local_248 = __ptr;
              while( true ) {
                cVar31 = 'w';
                __ptr = (double *)malloc(0x18);
                __ptr[2] = (double)local_248;
                *__ptr = 0.0;
                __ptr[1] = 0.0;
                pcVar23 = (char *)(__ptr + 1);
                iVar26 = update_arg(__ptr,(char **)pcVar23,(uint *)0x0,&local_128.molFraction_given,
                                    pcVar25,(char **)0x0,(char *)0x3,ARG_NO,1,1,1,0x28f838,
                                    (char *)0x2d,cVar31,
                                    (char *)CONCAT44(iVar32,in_stack_fffffffffffffda8));
                if (iVar26 != 0) {
                  if (pcVar25 == (char *)0x0) goto LAB_0012c0e8;
                  free(pcVar25);
                  goto LAB_0012c0e8;
                }
                puVar18 = extraout_RDX_05;
                if (pcVar11 == (char *)0x0) break;
                pcVar25 = get_multiple_arg_token(pcVar11);
                pcVar11 = get_multiple_arg_token_next(pcVar11);
                local_248 = __ptr;
              }
            }
            goto LAB_0012b8a6;
          }
          if ((pcVar25[1] == 'x') && (pcVar25[2] == '\0')) {
            iVar26 = 0x28f82f;
            puVar18 = &local_128.nx_given;
            field_given = &args_info->nx_given;
            pcVar23 = (char *)&args_info->nx_orig;
            ppcVar13 = (char **)&args_info->nx_arg;
          }
          else if ((pcVar25[1] == 'y') && (pcVar25[2] == '\0')) {
            iVar26 = 0x28f832;
            puVar18 = &local_128.ny_given;
            field_given = &args_info->ny_given;
            pcVar23 = (char *)&args_info->ny_orig;
            ppcVar13 = (char **)&args_info->ny_arg;
          }
          else {
            if ((pcVar25[1] != 'z') || (pcVar25[2] != '\0')) goto LAB_0012be34;
            iVar26 = 0x28f835;
            puVar18 = &local_128.nz_given;
            field_given = &args_info->nz_given;
            pcVar23 = (char *)&args_info->nz_orig;
            ppcVar13 = (char **)&args_info->nz_arg;
          }
          pcVar11 = (char *)0x2d;
          possible_values = (char **)0x0;
          pcVar25 = (char *)0x2;
        }
      }
      else {
        if (iVar26 == 0x6c) {
          possible_values = cmdline_parser_lattice_values;
          pcVar11 = (char *)0x6c;
          iVar26 = 0x28f844;
          puVar18 = &local_128.lattice_given;
          field_given = &args_info->lattice_given;
          pcVar23 = (char *)&args_info->lattice_orig;
          ppcVar13 = &args_info->lattice_arg;
        }
        else {
          if (iVar26 != 0x6f) goto LAB_0012c47d;
          possible_values = (char **)0x0;
          pcVar11 = (char *)0x6f;
          iVar26 = 0x28f820;
          puVar18 = &local_128.output_given;
          field_given = &args_info->output_given;
          pcVar23 = (char *)&args_info->output_orig;
          ppcVar13 = &args_info->output_arg;
        }
        pcVar25 = (char *)0x1;
        pcVar21 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
        iVar32 = custom_opterr;
      }
      iVar26 = update_arg(ppcVar13,(char **)pcVar23,field_given,puVar18,pcVar21,possible_values,
                          pcVar25,arg_type,iVar7,0,0,iVar26,pcVar11,cVar31,
                          (char *)CONCAT44(iVar32,in_stack_fffffffffffffda8));
      puVar18 = extraout_RDX_06;
      pcVar25 = custom_optarg;
    } while (iVar26 == 0);
    while (custom_optarg = pcVar25, __ptr != (double *)0x0) {
LAB_0012c0e8:
      if ((void *)__ptr[1] != (void *)0x0) {
        free((void *)__ptr[1]);
      }
      pdVar14 = (double *)__ptr[2];
      free(__ptr);
      __ptr = pdVar14;
      pcVar25 = custom_optarg;
    }
    cmdline_parser_release(&local_128);
    iVar7 = 1;
  }
  return iVar7;
LAB_0012c47d:
  while (iVar32 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0, (int)uVar20 != 0x68) {
LAB_0012c476:
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar32;
    cmdline_parser_internal();
  }
  cmdline_parser_print_help();
LAB_0012c487:
  cmdline_parser_free(&local_128);
  exit(0);
}

Assistant:

int
cmdline_parser_internal (
  int argc, char **argv, struct gengetopt_args_info *args_info,
                        struct cmdline_parser_params *params, const char *additional_error)
{
  int c;	/* Character of the parsed option.  */

  struct generic_list * molFraction_list = NULL;
  int error_occurred = 0;
  struct gengetopt_args_info local_args_info;
  
  int override;
  int initialize;
  int check_required;
  int check_ambiguity;

  char *optarg;
  int optind;
  int opterr;
  int optopt;
  
  package_name = argv[0];
  
  override = params->override;
  initialize = params->initialize;
  check_required = params->check_required;
  check_ambiguity = params->check_ambiguity;

  if (initialize)
    cmdline_parser_init (args_info);

  cmdline_parser_init (&local_args_info);

  optarg = 0;
  optind = 0;
  opterr = params->print_errors;
  optopt = '?';

  while (1)
    {
      int option_index = 0;

      static struct option long_options[] = {
        { "help",	0, NULL, 'h' },
        { "version",	0, NULL, 'V' },
        { "output",	1, NULL, 'o' },
        { "density",	1, NULL, 0 },
        { "nx",	1, NULL, 0 },
        { "ny",	1, NULL, 0 },
        { "nz",	1, NULL, 0 },
        { "molFraction",	1, NULL, 0 },
        { "lattice",	1, NULL, 'l' },
        { 0,  0, 0, 0 }
      };

      custom_optarg = optarg;
      custom_optind = optind;
      custom_opterr = opterr;
      custom_optopt = optopt;

      c = custom_getopt_long (argc, argv, "hVo:l:", long_options, &option_index);

      optarg = custom_optarg;
      optind = custom_optind;
      opterr = custom_opterr;
      optopt = custom_optopt;

      if (c == -1) break;	/* Exit from `while (1)' loop.  */

      switch (c)
        {
        case 'h':	/* Print help and exit.  */
          cmdline_parser_print_help ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'V':	/* Print version and exit.  */
          cmdline_parser_print_version ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'o':	/* Output file name.  */
        
        
          if (update_arg( (void *)&(args_info->output_arg), 
               &(args_info->output_orig), &(args_info->output_given),
              &(local_args_info.output_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "output", 'o',
              additional_error))
            goto failure;
        
          break;
        case 'l':	/* Lattice Type.  */
        
        
          if (update_arg( (void *)&(args_info->lattice_arg), 
               &(args_info->lattice_orig), &(args_info->lattice_given),
              &(local_args_info.lattice_given), optarg, cmdline_parser_lattice_values, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "lattice", 'l',
              additional_error))
            goto failure;
        
          break;

        case 0:	/* Long option with no short option */
          /* density (g/cm^3).  */
          if (strcmp (long_options[option_index].name, "density") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->density_arg), 
                 &(args_info->density_orig), &(args_info->density_given),
                &(local_args_info.density_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "density", '-',
                additional_error))
              goto failure;
          
          }
          /* number of unit cells in x.  */
          else if (strcmp (long_options[option_index].name, "nx") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->nx_arg), 
                 &(args_info->nx_orig), &(args_info->nx_given),
                &(local_args_info.nx_given), optarg, 0, 0, ARG_INT,
                check_ambiguity, override, 0, 0,
                "nx", '-',
                additional_error))
              goto failure;
          
          }
          /* number of unit cells in y.  */
          else if (strcmp (long_options[option_index].name, "ny") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->ny_arg), 
                 &(args_info->ny_orig), &(args_info->ny_given),
                &(local_args_info.ny_given), optarg, 0, 0, ARG_INT,
                check_ambiguity, override, 0, 0,
                "ny", '-',
                additional_error))
              goto failure;
          
          }
          /* number of unit cells in z.  */
          else if (strcmp (long_options[option_index].name, "nz") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->nz_arg), 
                 &(args_info->nz_orig), &(args_info->nz_given),
                &(local_args_info.nz_given), optarg, 0, 0, ARG_INT,
                check_ambiguity, override, 0, 0,
                "nz", '-',
                additional_error))
              goto failure;
          
          }
          /* (Default) Builds a multi-component random mixed nanoparticle. Mole Fraction must be specified for each componet > 1 in MD file..  */
          else if (strcmp (long_options[option_index].name, "molFraction") == 0)
          {
          
            if (update_multiple_arg_temp(&molFraction_list, 
                &(local_args_info.molFraction_given), optarg, 0, 0, ARG_DOUBLE,
                "molFraction", '-',
                additional_error))
              goto failure;
          
          }
          
          break;
        case '?':	/* Invalid option.  */
          /* `getopt_long' already printed an error message.  */
          goto failure;

        default:	/* bug: option not considered.  */
          fprintf (stderr, "%s: option unknown: %c%s\n", CMDLINE_PARSER_PACKAGE, c, (additional_error ? additional_error : ""));
          abort ();
        } /* switch */
    } /* while */


  update_multiple_arg((void *)&(args_info->molFraction_arg),
    &(args_info->molFraction_orig), args_info->molFraction_given,
    local_args_info.molFraction_given, 0,
    ARG_DOUBLE, molFraction_list);

  args_info->molFraction_given += local_args_info.molFraction_given;
  local_args_info.molFraction_given = 0;
  
  if (check_required)
    {
      error_occurred += cmdline_parser_required2 (args_info, argv[0], additional_error);
    }

  cmdline_parser_release (&local_args_info);

  if ( error_occurred )
    return (EXIT_FAILURE);

  if (optind < argc)
    {
      int i = 0 ;
      int found_prog_name = 0;
      /* whether program name, i.e., argv[0], is in the remaining args
         (this may happen with some implementations of getopt,
          but surely not with the one included by gengetopt) */


      args_info->inputs_num = argc - optind - found_prog_name;
      args_info->inputs =
        (char **)(malloc ((args_info->inputs_num)*sizeof(char *))) ;
      while (optind < argc)
        args_info->inputs[ i++ ] = gengetopt_strdup (argv[optind++]) ;
    }

  return 0;

failure:
  free_list (molFraction_list, 0 );
  
  cmdline_parser_release (&local_args_info);
  return (EXIT_FAILURE);
}